

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall cs_impl::fiber::Routine::~Routine(Routine *this)

{
  long in_RDI;
  unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_> *unaff_retaddr;
  stack_type<cs::domain_type,_std::allocator> *this_00;
  
  this_00 = *(stack_type<cs::domain_type,_std::allocator> **)(in_RDI + 0x60);
  if (this_00 != (stack_type<cs::domain_type,_std::allocator> *)0x0) {
    operator_delete__(this_00);
  }
  std::function<void_()>::~function((function<void_()> *)0x210e28);
  cs::stack_type<cs::domain_type,_std::allocator>::~stack_type(this_00);
  std::unique_ptr<cs::process_context,_std::default_delete<cs::process_context>_>::~unique_ptr
            (unaff_retaddr);
  return;
}

Assistant:

~Routine()
			{
				delete[] stack;
			}